

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void boost::this_thread::interruption_point(void)

{
  thread_data_base *ptVar1;
  undefined8 uVar2;
  
  ptVar1 = detail::get_current_thread_data();
  if ((ptVar1 != (thread_data_base *)0x0) && (ptVar1->interrupt_enabled == true)) {
    mutex::lock(&ptVar1->data_mutex);
    if (ptVar1->interrupt_requested == true) {
      ptVar1->interrupt_requested = false;
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&thread_interrupted::typeinfo,0);
    }
    mutex::unlock(&ptVar1->data_mutex);
  }
  return;
}

Assistant:

void interruption_point()
        {
#ifndef BOOST_NO_EXCEPTIONS
            boost::detail::thread_data_base* const thread_info=detail::get_current_thread_data();
            if(thread_info && thread_info->interrupt_enabled)
            {
                lock_guard<mutex> lg(thread_info->data_mutex);
                if(thread_info->interrupt_requested)
                {
                    thread_info->interrupt_requested=false;
                    throw thread_interrupted();
                }
            }
#endif
        }